

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlp.cpp
# Opt level: O3

void __thiscall
seeta::fd::MLP::AddLayer
          (MLP *this,int32_t inputDim,int32_t outputDim,float *weights,float *bias,bool is_output)

{
  pointer psVar1;
  element_type *peVar2;
  int iVar3;
  shared_ptr<seeta::fd::MLPLayer> layer;
  value_type local_40;
  
  psVar1 = (this->layers_).
           super__Vector_base<std::shared_ptr<seeta::fd::MLPLayer>,_std::allocator<std::shared_ptr<seeta::fd::MLPLayer>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((psVar1 == (this->layers_).
                 super__Vector_base<std::shared_ptr<seeta::fd::MLPLayer>,_std::allocator<std::shared_ptr<seeta::fd::MLPLayer>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) ||
     ((psVar1[-1].super___shared_ptr<seeta::fd::MLPLayer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      output_dim_ == inputDim)) {
    local_40.super___shared_ptr<seeta::fd::MLPLayer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)operator_new(0x40);
    (local_40.super___shared_ptr<seeta::fd::MLPLayer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    act_func_type_ = (uint)!is_output;
    (local_40.super___shared_ptr<seeta::fd::MLPLayer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    input_dim_ = 0;
    (local_40.super___shared_ptr<seeta::fd::MLPLayer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    output_dim_ = 0;
    ((local_40.super___shared_ptr<seeta::fd::MLPLayer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->weights_
    ).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    ((local_40.super___shared_ptr<seeta::fd::MLPLayer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->weights_
    ).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    ((local_40.super___shared_ptr<seeta::fd::MLPLayer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->weights_
    ).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    ((local_40.super___shared_ptr<seeta::fd::MLPLayer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->bias_).
    super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    ((local_40.super___shared_ptr<seeta::fd::MLPLayer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->bias_).
    super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    ((local_40.super___shared_ptr<seeta::fd::MLPLayer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->bias_).
    super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<seeta::fd::MLPLayer*>
              (&local_40.super___shared_ptr<seeta::fd::MLPLayer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,
               local_40.super___shared_ptr<seeta::fd::MLPLayer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    peVar2 = local_40.super___shared_ptr<seeta::fd::MLPLayer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (0 < inputDim && 0 < outputDim) {
      (local_40.super___shared_ptr<seeta::fd::MLPLayer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      input_dim_ = inputDim;
      (local_40.super___shared_ptr<seeta::fd::MLPLayer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      output_dim_ = outputDim;
      std::vector<float,_std::allocator<float>_>::resize
                (&(local_40.super___shared_ptr<seeta::fd::MLPLayer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->weights_,(ulong)(uint)(inputDim * outputDim));
      std::vector<float,_std::allocator<float>_>::resize(&peVar2->bias_,(ulong)(uint)outputDim);
    }
    if ((weights != (float *)0x0) &&
       (iVar3 = (local_40.super___shared_ptr<seeta::fd::MLPLayer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                )->output_dim_ *
                (local_40.super___shared_ptr<seeta::fd::MLPLayer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                )->input_dim_, iVar3 != 0 && iVar3 == inputDim * outputDim)) {
      memmove(((local_40.super___shared_ptr<seeta::fd::MLPLayer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->weights_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start,weights,(long)(inputDim * outputDim) << 2);
    }
    if ((bias != (float *)0x0) &&
       ((local_40.super___shared_ptr<seeta::fd::MLPLayer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        output_dim_ != 0 &&
        (local_40.super___shared_ptr<seeta::fd::MLPLayer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        output_dim_ == outputDim)) {
      memmove(((local_40.super___shared_ptr<seeta::fd::MLPLayer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->bias_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start,bias,(long)outputDim << 2);
    }
    std::
    vector<std::shared_ptr<seeta::fd::MLPLayer>,_std::allocator<std::shared_ptr<seeta::fd::MLPLayer>_>_>
    ::push_back(&this->layers_,&local_40);
    if (local_40.super___shared_ptr<seeta::fd::MLPLayer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_40.super___shared_ptr<seeta::fd::MLPLayer,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

void MLP::AddLayer(int32_t inputDim, int32_t outputDim, const float* weights,
    const float* bias, bool is_output) {
  if (layers_.size() > 0 && inputDim != layers_.back()->GetOutputDim())
    return;  // @todo handle the errors!!!

  std::shared_ptr<seeta::fd::MLPLayer> layer(new seeta::fd::MLPLayer(is_output ? 0 : 1));
  layer->SetSize(inputDim, outputDim);
  layer->SetWeights(weights, inputDim * outputDim);
  layer->SetBias(bias, outputDim);
  layers_.push_back(layer);
}